

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O2

void __thiscall TC_parser<false>::listFeatures(TC_parser<false> *this)

{
  char cVar1;
  char *pos;
  char *pcVar2;
  
  while( true ) {
    pos = this->reading_head;
    cVar1 = *pos;
    if ((cVar1 != '\t') && (cVar1 != ' ')) break;
    pcVar2 = this->endLine;
    if (pcVar2 <= pos) goto LAB_0022cfe3;
    this->reading_head = pos + 1;
    maybeFeature(this);
  }
  pcVar2 = this->endLine;
LAB_0022cfe3:
  if (((pos != pcVar2) && (cVar1 != '\r')) && (cVar1 != '|')) {
    parserWarning(this,"malformed example! \'|\',space, or EOL expected after : \"",this->beginLine,
                  pos,"\"");
    return;
  }
  return;
}

Assistant:

inline void listFeatures()
  {
    while ((*reading_head == ' ' || *reading_head == '\t') && (reading_head < endLine))
    {
      // listFeatures --> ' ' MaybeFeature ListFeatures
      ++reading_head;
      maybeFeature();
    }
    if (!(*reading_head == '|' || reading_head == endLine || *reading_head == '\r'))
    {
      // syntax error
      parserWarning("malformed example! '|',space, or EOL expected after : \"", beginLine, reading_head, "\"");
    }
  }